

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

void cppurses::System::post_event
               (unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *event)

{
  Event_engine *this;
  Event_queue *this_00;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> local_18;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *local_10;
  unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> *event_local;
  
  local_10 = event;
  this = detail::Event_engine::get();
  this_00 = detail::Event_engine::queue(this);
  std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::unique_ptr
            (&local_18,event);
  detail::Event_queue::append(this_00,&local_18);
  std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

void System::post_event(std::unique_ptr<Event> event)
{
    detail::Event_engine::get().queue().append(std::move(event));
}